

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::a64::Assembler::align(Assembler *this,AlignMode alignMode,uint32_t alignment)

{
  CodeHolder *this_00;
  Section *pSVar1;
  Logger *pLVar2;
  Error extraout_EAX;
  Error EVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  uint8_t *__s;
  ulong local_e0;
  undefined8 local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [136];
  
  this_00 = (this->super_BaseAssembler).super_BaseEmitter._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar3 = 5;
  }
  else {
    if (alignMode < (kMaxValue|kData)) {
      if (alignment < 2) {
        return 0;
      }
      if ((alignment < 0x41) &&
         (uVar5 = alignment - (alignment >> 1 & 0x55555555),
         uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333),
         ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
        __s = (this->super_BaseAssembler)._bufferPtr;
        lVar4 = (long)__s - (long)(this->super_BaseAssembler)._bufferData;
        uVar8 = (-(ulong)alignment & (lVar4 + (ulong)alignment) - 1) - lVar4;
        if ((int)uVar8 == 0) {
          return 0;
        }
        uVar6 = uVar8 & 0xffffffff;
        if ((ulong)((long)(this->super_BaseAssembler)._bufferEnd - (long)__s) < uVar6) {
          EVar3 = CodeHolder::growBuffer
                            (this_00,&((this->super_BaseAssembler)._section)->_buffer,uVar6);
          local_e0 = uVar6;
          if (EVar3 != 0) goto LAB_00134703;
          __s = (this->super_BaseAssembler)._bufferPtr;
        }
        while (alignMode == kCode) {
          if ((*(int *)&(this->super_BaseAssembler)._bufferPtr -
               *(int *)&(this->super_BaseAssembler)._bufferData & 3U) != 0) {
            return 3;
          }
          if (3 < (uint)uVar8) {
            do {
              __s[0] = '\x1f';
              __s[1] = ' ';
              __s[2] = '\x03';
              __s[3] = 0xd5;
              __s = __s + 4;
              uVar5 = (int)uVar8 - 4;
              uVar8 = (ulong)uVar5;
            } while (3 < uVar5);
            if (uVar5 == 0) goto LAB_001345bd;
          }
          align();
          EVar3 = extraout_EAX;
LAB_00134703:
          EVar3 = BaseEmitter::reportError((BaseEmitter *)this,EVar3,(char *)0x0);
          uVar6 = local_e0;
          if (EVar3 != 0) {
            return EVar3;
          }
        }
        if (uVar6 == 0) goto LAB_001346f1;
        memset(__s,0,uVar6);
        __s = __s + uVar6;
LAB_001345bd:
        pSVar1 = (this->super_BaseAssembler)._section;
        uVar8 = (long)__s - (long)(this->super_BaseAssembler)._bufferData;
        if (uVar8 <= (pSVar1->_buffer)._capacity) {
          (this->super_BaseAssembler)._bufferPtr = __s;
          uVar6 = (pSVar1->_buffer)._size;
          if (uVar8 < uVar6) {
            uVar8 = uVar6;
          }
          (pSVar1->_buffer)._size = uVar8;
          pLVar2 = (this->super_BaseAssembler).super_BaseEmitter._logger;
          if (pLVar2 != (Logger *)0x0) {
            local_c0 = local_b8;
            uStack_d0 = 0;
            local_d8 = 0x20;
            local_c8 = 0x87;
            local_b8[0] = 0;
            String::_opChars((String *)&local_d8,kAppend,' ',
                             (ulong)(pLVar2->_options)._indentation._data[0]);
            String::_opFormat((String *)&local_d8,kAppend,"align %u\n",(ulong)alignment);
            pLVar2 = (this->super_BaseAssembler).super_BaseEmitter._logger;
            uVar8 = uStack_d0;
            puVar7 = local_c0;
            if ((local_d8 & 0xff) < 0x1f) {
              uVar8 = local_d8 & 0xff;
              puVar7 = (undefined1 *)((long)&local_d8 + 1);
            }
            (*pLVar2->_vptr_Logger[2])(pLVar2,puVar7,uVar8);
            String::reset((String *)&local_d8);
            return 0;
          }
          return 0;
        }
        align();
LAB_001346f1:
        align();
        return 3;
      }
    }
    EVar3 = 2;
  }
  EVar3 = BaseEmitter::reportError((BaseEmitter *)this,EVar3,(char *)0x0);
  return EVar3;
}

Assistant:

Error Assembler::align(AlignMode alignMode, uint32_t alignment) {
  constexpr uint32_t kNopA64 = 0xD503201Fu; // [11010101|00000011|00100000|00011111].

  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(uint32_t(alignMode) > uint32_t(AlignMode::kMaxValue)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (ASMJIT_UNLIKELY(alignment > Globals::kMaxAlignment || !Support::isPowerOf2(alignment)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = uint32_t(Support::alignUpDiff<size_t>(offset(), alignment));
  if (i == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, i));

  switch (alignMode) {
    case AlignMode::kCode: {
      uint32_t pattern = kNopA64;

      if (ASMJIT_UNLIKELY(offset() & 0x3u))
        return DebugUtils::errored(kErrorInvalidState);

      while (i >= 4) {
        writer.emit32uLE(pattern);
        i -= 4;
      }

      ASMJIT_ASSERT(i == 0);
      break;
    }

    case AlignMode::kData:
    case AlignMode::kZero:
      writer.emitZeros(i);
      break;
  }

  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<128> sb;
    sb.appendChars(' ', _logger->indentation(FormatIndentationGroup::kCode));
    sb.appendFormat("align %u\n", alignment);
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}